

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

void slang::ast::getHierarchicalPathImpl(Symbol *symbol,FormatBuffer *buffer)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  format_string<int> fmt;
  string_view text;
  string_view text_00;
  string_view text_01;
  bool bVar1;
  FormatBuffer *buffer_00;
  InstanceBodySymbol *pIVar2;
  CheckerInstanceBodySymbol *pCVar3;
  GenerateBlockSymbol *pGVar4;
  InstanceSymbolBase *pIVar5;
  size_type sVar6;
  Symbol *in_RSI;
  InstanceSymbol *in_RDI;
  size_t i;
  span<const_unsigned_int,_18446744073709551615UL> arrayPath;
  span<const_slang::ConstantRange,_18446744073709551615UL> instanceDims;
  SmallVector<slang::ConstantRange,_8UL> instanceDimVec;
  InstanceSymbolBase *inst;
  SVInt *index;
  GenerateBlockSymbol *block;
  GenerateBlockArraySymbol *array;
  anon_class_24_3_8c777969 addName;
  anon_class_1_0_00000001 needsEscaping;
  Symbol *parent;
  string_view separator;
  Symbol *current;
  Scope *scope;
  SmallVectorBase<slang::ConstantRange> *in_stack_fffffffffffffda8;
  InstanceSymbolBase *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  FormatBuffer *in_stack_fffffffffffffdc0;
  size_type sVar7;
  size_t in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  int *in_stack_fffffffffffffde0;
  FormatBuffer *in_stack_fffffffffffffde8;
  anon_class_24_3_8c777969 *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  undefined1 *puVar8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  size_type local_1e8;
  span<const_unsigned_int,_18446744073709551615UL> local_1e0;
  bitwidth_t in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  LiteralBase in_stack_fffffffffffffe37;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe38;
  undefined1 local_c0 [32];
  __sv_type local_a0;
  GenerateBlockArraySymbol *local_90;
  size_t local_88;
  char *local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  undefined1 *local_68;
  undefined1 local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  Symbol *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  InstanceSymbol *local_20;
  
  buffer_00 = (FormatBuffer *)Symbol::getParentScope((Symbol *)in_RDI);
  if ((buffer_00 == (FormatBuffer *)0x0) ||
     ((in_RDI->super_InstanceSymbolBase).super_Symbol.kind != InstanceBody)) {
    local_20 = in_RDI;
    if ((buffer_00 != (FormatBuffer *)0x0) &&
       ((in_RDI->super_InstanceSymbolBase).super_Symbol.kind == CheckerInstanceBody)) {
      pCVar3 = Symbol::as<slang::ast::CheckerInstanceBodySymbol>((Symbol *)0x4bbdcb);
      local_20 = (InstanceSymbol *)pCVar3->parentInstance;
      buffer_00 = (FormatBuffer *)Symbol::getParentScope((Symbol *)local_20);
    }
  }
  else {
    pIVar2 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x4bbd81);
    local_20 = pIVar2->parentInstance;
    buffer_00 = (FormatBuffer *)Symbol::getParentScope((Symbol *)local_20);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30);
  if (((buffer_00 != (FormatBuffer *)0x0) &&
      (local_38 = Scope::asSymbol((Scope *)buffer_00), local_38->kind != Root)) &&
     (local_38->kind != CompilationUnit)) {
    getHierarchicalPathImpl(in_RSI,buffer_00);
    if (((local_38->kind == Package) || (local_38->kind == ClassType)) ||
       (local_38->kind == CovergroupType)) {
      local_48 = sv((char *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8);
      local_30._M_len = local_48._M_len;
      local_30._M_str = local_48._M_str;
    }
    else {
      local_58 = sv((char *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8);
      local_30._M_len = local_58._M_len;
      local_30._M_str = local_58._M_str;
    }
  }
  local_59 = 0;
  local_78 = &local_30;
  local_68 = &local_59;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    (&(local_20->super_InstanceSymbolBase).super_Symbol.name);
  if (!bVar1) {
    local_88 = (local_20->super_InstanceSymbolBase).super_Symbol.name._M_len;
    local_80 = (local_20->super_InstanceSymbolBase).super_Symbol.name._M_str;
    text._M_str._0_4_ = in_stack_fffffffffffffe00;
    text._M_len = in_stack_fffffffffffffdf8;
    text._M_str._4_4_ = in_stack_fffffffffffffe04;
    getHierarchicalPathImpl::anon_class_24_3_8c777969::operator()(in_stack_fffffffffffffdf0,text);
  }
  if ((local_20->super_InstanceSymbolBase).super_Symbol.kind == GenerateBlockArray) {
    local_90 = Symbol::as<slang::ast::GenerateBlockArraySymbol>((Symbol *)0x4bbfb4);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      (&(local_20->super_InstanceSymbolBase).super_Symbol.name);
    if (bVar1) {
      puVar8 = local_c0;
      GenerateBlockArraySymbol::getExternalName_abi_cxx11_
                ((GenerateBlockArraySymbol *)in_stack_fffffffffffffde8);
      local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffdb0);
      text_00._M_str._0_4_ = in_stack_fffffffffffffe00;
      text_00._M_len = (size_t)puVar8;
      text_00._M_str._4_4_ = in_stack_fffffffffffffe04;
      getHierarchicalPathImpl::anon_class_24_3_8c777969::operator()
                (in_stack_fffffffffffffdf0,text_00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb0);
    }
  }
  else if ((local_20->super_InstanceSymbolBase).super_Symbol.kind == GenerateBlock) {
    pGVar4 = Symbol::as<slang::ast::GenerateBlockSymbol>((Symbol *)0x4bc081);
    if (pGVar4->arrayIndex == (SVInt *)0x0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        (&(local_20->super_InstanceSymbolBase).super_Symbol.name);
      if (bVar1) {
        GenerateBlockSymbol::getExternalName_abi_cxx11_
                  ((GenerateBlockSymbol *)in_stack_fffffffffffffde8);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdb0);
        text_01._M_str._0_4_ = in_stack_fffffffffffffe00;
        text_01._M_len = in_stack_fffffffffffffdf8;
        text_01._M_str._4_4_ = in_stack_fffffffffffffe04;
        getHierarchicalPathImpl::anon_class_24_3_8c777969::operator()
                  (in_stack_fffffffffffffdf0,text_01);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdb0);
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0,
                 (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      str._M_str = in_stack_fffffffffffffdd0;
      str._M_len = in_stack_fffffffffffffdc8;
      FormatBuffer::append(in_stack_fffffffffffffdc0,str);
      SVInt::toString_abi_cxx11_
                ((SVInt *)in_stack_fffffffffffffe38._M_extent_value,in_stack_fffffffffffffe37,
                 (bool)in_stack_fffffffffffffe36,in_stack_fffffffffffffe30);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb0);
      str_00._M_str = in_stack_fffffffffffffdd0;
      str_00._M_len = in_stack_fffffffffffffdc8;
      FormatBuffer::append(in_stack_fffffffffffffdc0,str_00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0,
                 (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      str_01._M_str = in_stack_fffffffffffffdd0;
      str_01._M_len = in_stack_fffffffffffffdc8;
      FormatBuffer::append(in_stack_fffffffffffffdc0,str_01);
    }
  }
  else if (((local_20->super_InstanceSymbolBase).super_Symbol.kind == Instance) ||
          ((local_20->super_InstanceSymbolBase).super_Symbol.kind == CheckerInstance)) {
    pIVar5 = Symbol::as<slang::ast::InstanceSymbolBase>((Symbol *)0x4bc29b);
    bVar1 = std::span<const_unsigned_int,_18446744073709551615UL>::empty
                      ((span<const_unsigned_int,_18446744073709551615UL> *)0x4bc2b4);
    if (!bVar1) {
      SmallVector<slang::ConstantRange,_8UL>::SmallVector
                ((SmallVector<slang::ConstantRange,_8UL> *)0x4bc2ce);
      InstanceSymbolBase::getArrayDimensions(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::span<const_slang::ConstantRange,_18446744073709551615UL>::
      span<slang::SmallVector<slang::ConstantRange,_8UL>_&>
                ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                 in_stack_fffffffffffffdc0,
                 (SmallVector<slang::ConstantRange,_8UL> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      local_1e0._M_ptr = (pIVar5->arrayPath)._M_ptr;
      local_1e0._M_extent._M_extent_value = (pIVar5->arrayPath)._M_extent._M_extent_value;
      local_1e8 = 0;
      while (sVar7 = local_1e8,
            sVar6 = std::span<const_slang::ConstantRange,_18446744073709551615UL>::size
                              ((span<const_slang::ConstantRange,_18446744073709551615UL> *)0x4bc338)
            , sVar7 < sVar6) {
        std::span<const_unsigned_int,_18446744073709551615UL>::operator[](&local_1e0,local_1e8);
        std::span<const_slang::ConstantRange,_18446744073709551615UL>::operator[]
                  ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                   &stack0xfffffffffffffe30,local_1e8);
        ConstantRange::lower((ConstantRange *)0x4bc39a);
        fmt.str.size_ = in_stack_fffffffffffffdf8;
        fmt.str.data_ = (char *)in_stack_fffffffffffffdf0;
        FormatBuffer::format<int>(in_stack_fffffffffffffde8,fmt,in_stack_fffffffffffffde0);
        local_1e8 = local_1e8 + 1;
      }
      SmallVector<slang::ConstantRange,_8UL>::~SmallVector
                ((SmallVector<slang::ConstantRange,_8UL> *)0x4bc40e);
    }
  }
  return;
}

Assistant:

static void getHierarchicalPathImpl(const Symbol& symbol, FormatBuffer& buffer) {
    auto scope = symbol.getParentScope();
    auto current = &symbol;
    if (scope && symbol.kind == SymbolKind::InstanceBody) {
        current = symbol.as<InstanceBodySymbol>().parentInstance;
        SLANG_ASSERT(current);

        scope = current->getParentScope();
    }
    else if (scope && symbol.kind == SymbolKind::CheckerInstanceBody) {
        current = symbol.as<CheckerInstanceBodySymbol>().parentInstance;
        SLANG_ASSERT(current);

        scope = current->getParentScope();
    }

    std::string_view separator;
    if (scope) {
        auto& parent = scope->asSymbol();
        if (parent.kind != SymbolKind::Root && parent.kind != SymbolKind::CompilationUnit) {
            getHierarchicalPathImpl(parent, buffer);
            if (parent.kind == SymbolKind::Package || parent.kind == SymbolKind::ClassType ||
                parent.kind == SymbolKind::CovergroupType) {
                separator = "::"sv;
            }
            else {
                separator = "."sv;
            }
        }
    }

    auto needsEscaping = [](std::string_view text) {
        if (!text.empty()) {
            if (!isValidCIdChar(text[0]) || isDecimalDigit(text[0]))
                return true;

            for (size_t i = 1; i < text.length(); i++) {
                if (!isValidCIdChar(text[i]) && text[i] != '$')
                    return true;
            }
        }
        return false;
    };

    auto addName = [&](std::string_view text) {
        if (!separator.empty())
            buffer.append(separator);

        // If the name requires escaping add that here.
        if (needsEscaping(text))
            buffer.format("\\{} ", text);
        else
            buffer.append(text);
    };

    if (!current->name.empty())
        addName(current->name);

    if (current->kind == SymbolKind::GenerateBlockArray) {
        auto& array = current->as<GenerateBlockArraySymbol>();
        if (current->name.empty())
            addName(array.getExternalName());
    }
    else if (current->kind == SymbolKind::GenerateBlock) {
        auto& block = current->as<GenerateBlockSymbol>();
        if (auto index = block.arrayIndex) {
            buffer.append("[");
            buffer.append(index->toString(LiteralBase::Decimal, false));
            buffer.append("]");
        }
        else if (current->name.empty()) {
            addName(block.getExternalName());
        }
    }
    else if (current->kind == SymbolKind::Instance ||
             current->kind == SymbolKind::CheckerInstance) {
        auto& inst = current->as<InstanceSymbolBase>();
        if (!inst.arrayPath.empty()) {
            SmallVector<ConstantRange, 8> instanceDimVec;
            inst.getArrayDimensions(instanceDimVec);

            std::span<const ConstantRange> instanceDims = instanceDimVec;
            std::span<const uint32_t> arrayPath = inst.arrayPath;
            SLANG_ASSERT(instanceDims.size() == arrayPath.size());

            for (size_t i = 0; i < instanceDims.size(); i++)
                buffer.format("[{}]", int32_t(arrayPath[i]) + instanceDims[i].lower());
        }
    }
}